

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O3

char * duckdb_parameter_name(duckdb_prepared_statement prepared_statement,idx_t index)

{
  char *pcVar1;
  string identifier;
  string local_30;
  
  duckdb_parameter_name_internal_abi_cxx11_(&local_30,prepared_statement,index);
  if (local_30._M_string_length == 0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return pcVar1;
}

Assistant:

const char *duckdb_parameter_name(duckdb_prepared_statement prepared_statement, idx_t index) {
	auto identifier = duckdb_parameter_name_internal(prepared_statement, index);
	if (identifier == duckdb::string()) {
		return NULL;
	}
	return strdup(identifier.c_str());
}